

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O0

double log1p(double __x)

{
  double dVar1;
  double dVar2;
  undefined8 local_28;
  double z;
  double y;
  double x_local;
  
  dVar1 = (__x + 1.0) - 1.0;
  if ((dVar1 != 0.0) || (local_28 = __x, NAN(dVar1))) {
    dVar2 = log(__x + 1.0);
    local_28 = (__x * dVar2) / dVar1;
  }
  return local_28;
}

Assistant:

double log1p(double x) {
	/*
	 * This log(1+x) algorithm is courtesy of Charles kerney and John D Cook
	 * http://www.johndcook.com/blog/2012/07/25/trick-for-computing-log1x/
	 * and 
	 * http://geographiclib.sourceforge.net/html/Math_8hpp_source.html#l00241
	 * 
	 */ 
	volatile double y,z;
	y = 1 + x;
	z = y - 1;
	return z == 0 ? x : x * log(y) / z;
}